

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

void __thiscall CoreReadTask::execute(CoreReadTask *this)

{
  long lVar1;
  long in_RDI;
  exr_coding_channel_info_t *outc;
  int c_1;
  int c;
  int bytesperpixel;
  uint8_t *curchanptr;
  exr_result_t rv;
  exr_decode_pipeline_t chunk;
  exr_chunk_info_t cinfo;
  int local_244;
  int local_240;
  int local_23c;
  long local_238;
  int local_22c;
  long local_228;
  short local_220;
  undefined1 local_48 [72];
  
  memset(local_48,0,0x40);
  local_22c = exr_read_scanline_chunk_info
                        (*(undefined8 *)(in_RDI + 0x10),0,*(undefined4 *)(in_RDI + 0x18),local_48);
  if (local_22c == 0) {
    local_22c = exr_decoding_initialize(*(undefined8 *)(in_RDI + 0x10),0,local_48,&local_228);
  }
  if (local_22c == 0) {
    local_238 = *(long *)(in_RDI + 0x20);
    local_23c = 0;
    for (local_240 = 0; local_240 < local_220; local_240 = local_240 + 1) {
      local_23c = *(char *)(local_228 + (long)local_240 * 0x30 + 0x19) + local_23c;
    }
    for (local_244 = 0; local_244 < local_220; local_244 = local_244 + 1) {
      lVar1 = local_228 + (long)local_244 * 0x30;
      *(long *)(lVar1 + 0x28) = local_238;
      *(int *)(lVar1 + 0x20) = local_23c;
      *(int *)(lVar1 + 0x24) = *(int *)(lVar1 + 0xc) * local_23c;
      *(short *)(lVar1 + 0x1c) = (short)*(char *)(local_228 + (long)local_244 * 0x30 + 0x19);
      local_238 = local_238 + (int)*(char *)(local_228 + (long)local_244 * 0x30 + 0x19);
    }
    local_22c = exr_decoding_choose_default_routines(*(undefined8 *)(in_RDI + 0x10),0,&local_228);
  }
  if (local_22c == 0) {
    exr_decoding_run(*(undefined8 *)(in_RDI + 0x10),0,&local_228);
  }
  exr_decoding_destroy(*(undefined8 *)(in_RDI + 0x10),&local_228);
  return;
}

Assistant:

void execute () override
    {
        exr_chunk_info_t      cinfo = {0};
        exr_decode_pipeline_t chunk;
        exr_result_t rv = exr_read_scanline_chunk_info (_f, 0, _y, &cinfo);
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_decoding_initialize (_f, 0, &cinfo, &chunk);
        if (rv == EXR_ERR_SUCCESS)
        {
            uint8_t* curchanptr    = _ptr;
            int      bytesperpixel = 0;
            for (int c = 0; c < chunk.channel_count; ++c)
                bytesperpixel += chunk.channels[c].bytes_per_element;
            for (int c = 0; c < chunk.channel_count; ++c)
            {
                exr_coding_channel_info_t& outc = chunk.channels[c];
                outc.decode_to_ptr              = curchanptr;
                outc.user_pixel_stride          = bytesperpixel;
                outc.user_line_stride           = outc.width * bytesperpixel;
                outc.user_bytes_per_element =
                    chunk.channels[c].bytes_per_element;
                curchanptr += chunk.channels[c].bytes_per_element;
            }

            rv = exr_decoding_choose_default_routines (_f, 0, &chunk);
        }
        if (rv == EXR_ERR_SUCCESS) rv = exr_decoding_run (_f, 0, &chunk);
        exr_decoding_destroy (_f, &chunk);
    }